

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art_common.hpp
# Opt level: O0

type_conflict2 unodb::detail::shift_or_32bit_int<unsigned_long>(unsigned_long i)

{
  ulong uVar1;
  unsigned_long i_local;
  
  uVar1 = i >> 1 | i;
  uVar1 = uVar1 >> 2 | uVar1;
  uVar1 = uVar1 >> 4 | uVar1;
  uVar1 = uVar1 >> 8 | uVar1;
  return uVar1 >> 0x10 | uVar1;
}

Assistant:

constexpr typename std::enable_if<std::is_integral<T>::value, T>::type
shift_or_32bit_int(T i) {
  i |= (i >> 1);
  i |= (i >> 2);
  i |= (i >> 4);
  i |= (i >> 8);
  i |= (i >> 16);
  return i;
}